

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O0

cmCPackIFWRepository * __thiscall
cmCPackIFWGenerator::GetRepository(cmCPackIFWGenerator *this,string *repositoryName)

{
  cmCPackLog *this_00;
  bool bVar1;
  pointer ppVar2;
  ostream *poVar3;
  char *msg;
  string local_1e0 [48];
  ostringstream local_1b0 [8];
  ostringstream cmCPackLog_msg;
  cmCPackIFWGenerator *local_38;
  cmCPackIFWRepository *repository;
  _Self local_28;
  iterator rit;
  string *repositoryName_local;
  cmCPackIFWGenerator *this_local;
  
  rit._M_node = (_Base_ptr)repositoryName;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWRepository,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWRepository>_>_>
       ::find(&this->Repositories,repositoryName);
  repository = (cmCPackIFWRepository *)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWRepository,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWRepository>_>_>
               ::end(&this->Repositories);
  bVar1 = std::operator!=(&local_28,(_Self *)&repository);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWRepository>_>
             ::operator->(&local_28);
    this_local = (cmCPackIFWGenerator *)&ppVar2->second;
  }
  else {
    local_38 = (cmCPackIFWGenerator *)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWRepository,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWRepository>_>_>
               ::operator[](&this->Repositories,(key_type *)rit._M_node);
    std::__cxx11::string::operator=
              ((string *)&(local_38->super_cmCPackGenerator).GeneratorVerbose,(string *)rit._M_node)
    ;
    (local_38->super_cmCPackGenerator)._vptr_cmCPackGenerator = (_func_int **)this;
    bVar1 = cmCPackIFWRepository::ConfigureFromOptions((cmCPackIFWRepository *)local_38);
    if (bVar1) {
      if (*(int *)((long)&(local_38->super_cmCPackGenerator).Name.field_2 + 8) == 0) {
        std::vector<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>::push_back
                  (&(this->Installer).RemoteRepositories,(value_type *)&local_38);
      }
      else {
        std::vector<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>::push_back
                  (&(this->Repository).RepositoryUpdate,(value_type *)&local_38);
      }
    }
    else {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWRepository,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWRepository>_>_>
      ::erase(&this->Repositories,(key_type *)rit._M_node);
      local_38 = (cmCPackIFWGenerator *)0x0;
      std::__cxx11::ostringstream::ostringstream(local_1b0);
      poVar3 = std::operator<<((ostream *)local_1b0,"Invalid repository \"");
      poVar3 = std::operator<<(poVar3,(string *)rit._M_node);
      poVar3 = std::operator<<(poVar3,"\"");
      poVar3 = std::operator<<(poVar3," configuration. Repository will be skipped.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      if ((this->super_cmCPackIFWCommon).Generator != (cmCPackIFWGenerator *)0x0) {
        this_00 = (((this->super_cmCPackIFWCommon).Generator)->super_cmCPackGenerator).Logger;
        std::__cxx11::ostringstream::str();
        msg = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(this_00,8,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                        ,0x2b4,msg);
        std::__cxx11::string::~string(local_1e0);
      }
      std::__cxx11::ostringstream::~ostringstream(local_1b0);
    }
    this_local = local_38;
  }
  return (cmCPackIFWRepository *)this_local;
}

Assistant:

cmCPackIFWRepository* cmCPackIFWGenerator::GetRepository(
  const std::string& repositoryName)
{
  auto rit = this->Repositories.find(repositoryName);
  if (rit != this->Repositories.end()) {
    return &(rit->second);
  }

  cmCPackIFWRepository* repository = &this->Repositories[repositoryName];
  repository->Name = repositoryName;
  repository->Generator = this;
  if (repository->ConfigureFromOptions()) {
    if (repository->Update == cmCPackIFWRepository::None) {
      this->Installer.RemoteRepositories.push_back(repository);
    } else {
      this->Repository.RepositoryUpdate.push_back(repository);
    }
  } else {
    this->Repositories.erase(repositoryName);
    repository = nullptr;
    cmCPackIFWLogger(WARNING,
                     "Invalid repository \""
                       << repositoryName << "\""
                       << " configuration. Repository will be skipped."
                       << std::endl);
  }
  return repository;
}